

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_immutable_samplers
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *samplers,
          VkSampler **out_sampler)

{
  __node_base_ptr p_Var1;
  Impl *pIVar2;
  StateCreatorInterface *pSVar3;
  DatabaseInterface *resolver_00;
  bool bVar4;
  int iVar5;
  VkSampler *ppVVar6;
  ValueIterator pGVar7;
  Ch *__nptr;
  _Hash_node_base *p_Var8;
  __node_base_ptr p_Var9;
  ulong uVar10;
  ulong uVar11;
  char *__format;
  __node_base_ptr p_Var12;
  _Hash_node_base *p_Var13;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  __hash_code __code;
  long *in_FS_OFFSET;
  bool bVar14;
  size_t external_state_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  allocator_type local_81;
  Impl *local_80;
  StateCreatorInterface *local_78;
  size_type local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  VkSampler *local_50;
  VkSampler **local_48;
  DatabaseInterface *local_40;
  Value *local_38;
  
  local_80 = this;
  local_40 = resolver;
  if ((samplers->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x66a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar11 = (ulong)(samplers->data_).s.length;
  if (uVar11 == 0) {
    ppVVar6 = (VkSampler *)0x0;
  }
  else {
    ppVVar6 = (VkSampler *)ScratchAllocator::allocate_raw(&this->allocator,uVar11 << 3,0x10);
  }
  if ((samplers->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x68c,
                  "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)((ulong)(samplers->data_).s.str & 0xffffffffffff);
  local_48 = out_sampler;
  pGVar7 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::End(samplers);
  bVar14 = pGVar7 == this_00;
  local_78 = iface;
  local_38 = samplers;
  local_50 = ppVVar6;
  while( true ) {
    if (bVar14) {
      *local_48 = local_50;
      return bVar14;
    }
    __nptr = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this_00);
    p_Var8 = (_Hash_node_base *)strtoull(__nptr,(char **)0x0,0x10);
    resolver_00 = local_40;
    if (p_Var8 != (_Hash_node_base *)0x0) break;
LAB_00114245:
    this_00 = this_00 + 1;
    ppVVar6 = ppVVar6 + 1;
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(samplers);
    bVar14 = this_00 == pGVar7;
  }
  uVar11 = (local_80->replayed_samplers)._M_h._M_bucket_count;
  uVar10 = (ulong)p_Var8 % uVar11;
  p_Var1 = (local_80->replayed_samplers)._M_h._M_buckets[uVar10];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var1 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var1, p_Var12 = p_Var1->_M_nxt, p_Var8 != p_Var1->_M_nxt[1]._M_nxt)) {
    while (p_Var13 = p_Var12->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)p_Var13[1]._M_nxt % uVar11 != uVar10) ||
         (p_Var9 = p_Var12, p_Var12 = p_Var13, p_Var8 == p_Var13[1]._M_nxt)) goto LAB_001140cd;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_001140cd:
  if (p_Var9 == (__node_base_ptr)0x0) {
    p_Var13 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var13 = p_Var9->_M_nxt;
  }
  if (p_Var13 == (_Hash_node_base *)0x0) {
    local_70 = 0;
    if ((local_40 != (DatabaseInterface *)0x0) &&
       (iVar5 = (*local_40->_vptr_DatabaseInterface[3])(local_40,1,p_Var8,&local_70,0,0),
       (char)iVar5 != '\0')) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_68,local_70,&local_81);
      iVar5 = (*resolver_00->_vptr_DatabaseInterface[3])
                        (resolver_00,1,p_Var8,&local_70,
                         local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      pSVar3 = local_78;
      pIVar2 = local_80;
      if ((char)iVar5 == '\0') {
        if ((*(int *)(*in_FS_OFFSET + -0x18) < 2) &&
           (bVar4 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                               ,"Immutable sampler",p_Var8), !bVar4)) {
          fprintf(_stderr,
                  "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                  ,"Immutable sampler",p_Var8);
        }
LAB_00114362:
        if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          return bVar14;
        }
        operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        return bVar14;
      }
      bVar4 = parse(local_80,local_78,resolver_00,
                    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      if (!bVar4) goto LAB_00114362;
      (*pSVar3->_vptr_StateCreatorInterface[0x10])(pSVar3);
      uVar11 = (pIVar2->replayed_samplers)._M_h._M_bucket_count;
      uVar10 = (ulong)p_Var8 % uVar11;
      p_Var1 = (pIVar2->replayed_samplers)._M_h._M_buckets[uVar10];
      p_Var9 = (__node_base_ptr)0x0;
      if ((p_Var1 != (__node_base_ptr)0x0) &&
         (p_Var9 = p_Var1, p_Var12 = p_Var1->_M_nxt, p_Var8 != p_Var1->_M_nxt[1]._M_nxt)) {
        while (p_Var13 = p_Var12->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
          p_Var9 = (__node_base_ptr)0x0;
          if (((ulong)p_Var13[1]._M_nxt % uVar11 != uVar10) ||
             (p_Var9 = p_Var12, p_Var12 = p_Var13, p_Var8 == p_Var13[1]._M_nxt)) goto LAB_00114201;
        }
        p_Var9 = (__node_base_ptr)0x0;
      }
LAB_00114201:
      if (p_Var9 == (__node_base_ptr)0x0) {
        p_Var13 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var13 = p_Var9->_M_nxt;
      }
      if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00114229;
    }
  }
  else {
    (*local_78->_vptr_StateCreatorInterface[0x10])();
LAB_00114229:
    if (p_Var13 != (_Hash_node_base *)0x0) {
      if ((VkSampler)p_Var13[2]._M_nxt == (VkSampler)0x0) {
        if (1 < *(int *)(*in_FS_OFFSET + -0x18)) {
          return bVar14;
        }
        bVar4 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Referenced %s %016lx, but it is VK_NULL_HANDLE.\nThe create info was likely not supported by device.\n"
                           ,"Immutable sampler",p_Var8);
        if (bVar4) {
          return bVar14;
        }
        __format = 
        "Fossilize WARN: Referenced %s %016lx, but it is VK_NULL_HANDLE.\nThe create info was likely not supported by device.\n"
        ;
        goto LAB_00114316;
      }
      *ppVVar6 = (VkSampler)p_Var13[2]._M_nxt;
      samplers = local_38;
      goto LAB_00114245;
    }
  }
  if (1 < *(int *)(*in_FS_OFFSET + -0x18)) {
    return bVar14;
  }
  bVar4 = Internal::log_thread_callback
                    (LOG_DEFAULT,
                     "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                     ,"Immutable sampler",p_Var8);
  if (bVar4) {
    return bVar14;
  }
  __format = 
  "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
  ;
LAB_00114316:
  fprintf(_stderr,__format,"Immutable sampler",p_Var8);
  return bVar14;
}

Assistant:

bool StateReplayer::Impl::parse_immutable_samplers(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                   const Value &samplers, const VkSampler **out_sampler)
{
	auto *samps = allocator.allocate_n<VkSampler>(samplers.Size());
	auto *ret = samps;
	for (auto itr = samplers.Begin(); itr != samplers.End(); ++itr, samps++)
	{
		auto sampler_hash = string_to_uint64(itr->GetString());
		if (sampler_hash > 0)
		{
			auto sampler_itr = replayed_samplers.find(sampler_hash);
			if (sampler_itr == end(replayed_samplers))
			{
				size_t external_state_size = 0;
				if (!resolver || !resolver->read_entry(RESOURCE_SAMPLER, sampler_hash,
				                                       &external_state_size, nullptr,
				                                       PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Immutable sampler", sampler_hash);
					return false;
				}

				vector<uint8_t> external_state(external_state_size);

				if (!resolver->read_entry(RESOURCE_SAMPLER, sampler_hash,
				                          &external_state_size, external_state.data(),
				                          PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Immutable sampler", sampler_hash);
					return false;
				}

				if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
					return false;

				iface.sync_samplers();
				sampler_itr = replayed_samplers.find(sampler_hash);
			}
			else
				iface.sync_samplers();

			if (sampler_itr == replayed_samplers.end())
			{
				log_missing_resource("Immutable sampler", sampler_hash);
				return false;
			}
			else if (sampler_itr->second == VK_NULL_HANDLE)
			{
				log_invalid_resource("Immutable sampler", sampler_hash);
				return false;
			}

			*samps = sampler_itr->second;
		}
	}

	*out_sampler = ret;
	return true;
}